

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_generate_op(sexp ctx,sexp self,sexp_sint_t n,sexp ast,sexp env)

{
  sexp psVar1;
  sexp psVar2;
  sexp psVar3;
  sexp local_68;
  sexp vec;
  sexp_conflict local_58;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  sexp_gc_var_t local_30;
  
  vec = (sexp)&DAT_0000043e;
  local_68 = (sexp)0x43e;
  if (((ulong)env & 3) == 0) {
    if (env->tag == 0x17) {
      env = sexp_make_eval_context(ctx,(sexp)0x0,env,0,0);
    }
    else if (env->tag != 0x24) goto LAB_0012a1dc;
    local_50.var = &local_58;
    local_30.next = &local_50;
    local_50.next = (ctx->value).context.saves;
    local_30.var = &vec;
    local_40.next = &local_30;
    (ctx->value).context.saves = &local_40;
    local_58 = env;
    local_40.var = &local_68;
    sexp_free_vars(env,ast,(sexp)&DAT_0000023e);
    sexp_generate(local_58,(sexp_conflict)0x0,(sexp_conflict)0x0,(sexp_conflict)0x0,ast);
    local_68 = sexp_complete_bytecode(local_58);
    if ((((ulong)local_68 & 3) != 0) || (psVar2 = local_68, local_68->tag != 0x13)) {
      (local_58->value).port.size = 0x3e;
      psVar3 = sexp_make_vector_op(local_58,(sexp)0x0,2,(sexp)0x0,(sexp)&DAT_0000043e);
      psVar1 = local_68;
      if ((((ulong)psVar3 & 3) != 0) || (psVar2 = psVar3, psVar3->tag != 0x13)) {
        vec = psVar3;
        psVar2 = sexp_alloc_tagged_aux(local_58,0x20,0x14);
        (psVar2->value).flonum_bits[0x10] = '\x01';
        (psVar2->value).procedure.num_args = 0;
        (psVar2->value).type.name = psVar1;
        (psVar2->value).type.cpl = psVar3;
      }
    }
    (ctx->value).context.saves = local_50.next;
    return psVar2;
  }
LAB_0012a1dc:
  psVar2 = sexp_type_exception(ctx,self,0x17,env);
  return psVar2;
}

Assistant:

sexp sexp_generate_op (sexp ctx, sexp self, sexp_sint_t n, sexp ast, sexp env) {
  sexp_gc_var3(ctx2, vec, res);
  if (sexp_contextp(env)) {
    ctx2 = env;
  } else {
    sexp_assert_type(ctx, sexp_envp, SEXP_ENV, env);
    ctx2 = sexp_make_eval_context(ctx, NULL, env, 0, 0);
  }
  sexp_gc_preserve3(ctx, ctx2, vec, res);
  sexp_free_vars(ctx2, ast, SEXP_NULL);    /* should return SEXP_NULL */
  sexp_emit_enter(ctx2);
  sexp_generate(ctx2, 0, 0, 0, ast);
  res = sexp_complete_bytecode(ctx2);
  if (!sexp_exceptionp(res)) {
    sexp_context_specific(ctx2) = SEXP_FALSE;
    vec = sexp_make_vector(ctx2, 0, SEXP_VOID);
    if (sexp_exceptionp(vec)) res = vec;
    else res = sexp_make_procedure(ctx2, SEXP_ZERO, SEXP_ZERO, res, vec);
  }
  sexp_gc_release3(ctx);
  return res;
}